

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O0

void __thiscall
llvm::DWARFDebugNames::ValueIterator::ValueIterator
          (ValueIterator *this,DWARFDebugNames *AccelTable,StringRef Key)

{
  const_iterator pNVar1;
  DWARFDebugNames *AccelTable_local;
  ValueIterator *this_local;
  StringRef Key_local;
  
  Key_local.Data = (char *)Key.Length;
  this_local = (ValueIterator *)Key.Data;
  pNVar1 = SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>::begin
                     ((SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void> *)
                      &AccelTable->NameIndices);
  this->CurrentIndex = pNVar1;
  this->IsLocal = false;
  Optional<llvm::DWARFDebugNames::Entry>::Optional(&this->CurrentEntry);
  this->DataOffset = 0;
  StringRef::operator_cast_to_string(&this->Key,(StringRef *)&this_local);
  Optional<unsigned_int>::Optional(&this->Hash);
  searchFromStartOfCurrentIndex(this);
  return;
}

Assistant:

DWARFDebugNames::ValueIterator::ValueIterator(const DWARFDebugNames &AccelTable,
                                              StringRef Key)
    : CurrentIndex(AccelTable.NameIndices.begin()), IsLocal(false), Key(Key) {
  searchFromStartOfCurrentIndex();
}